

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3-prov.c
# Opt level: O0

int blake3_digest_final(void *vctx,uchar *out,size_t *outl,size_t outsz)

{
  uint8_t *in_stack_ffffffffffffffc8;
  blake3_ctx *ctx;
  size_t outsz_local;
  size_t *outl_local;
  uchar *out_local;
  void *vctx_local;
  
  ctx = (blake3_ctx *)outsz;
  if (*(long *)((long)vctx + 8) != 0) {
    ctx = *(blake3_ctx **)((long)vctx + 8);
  }
  *outl = (size_t)ctx;
  if (ctx != (blake3_ctx *)0x0) {
    blake3_hasher_finalize((blake3_hasher *)vctx,in_stack_ffffffffffffffc8,0x1023ce);
  }
  return 1;
}

Assistant:

int blake3_digest_final(void *vctx, unsigned char *out, size_t *outl,
			size_t outsz)
{
	struct blake3_ctx *ctx = vctx;

	if(ctx->out_len)
		outsz = ctx->out_len;

	*outl = outsz;
	if (outsz != 0)
		blake3_hasher_finalize(&ctx->md, out, outsz);

	return 1;
}